

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O0

int amqp_connection_get_session_handle
              (AMQP_CONNECTION_HANDLE conn_handle,SESSION_HANDLE *session_handle)

{
  LOGGER_LOG p_Var1;
  AMQP_CONNECTION_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SESSION_HANDLE *session_handle_local;
  AMQP_CONNECTION_HANDLE conn_handle_local;
  
  if (conn_handle == (AMQP_CONNECTION_HANDLE)0x0) {
    l._4_4_ = 0x199;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_get_session_handle",0x19a,1,
                "amqp_connection_get_session_handle failed (conn_handle is NULL)");
    }
  }
  else if (session_handle == (SESSION_HANDLE *)0x0) {
    l._4_4_ = 0x19e;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_get_session_handle",0x19f,1,
                "amqp_connection_get_session_handle failed (session_handle is NULL)");
    }
  }
  else {
    *session_handle = conn_handle->session_handle;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int amqp_connection_get_session_handle(AMQP_CONNECTION_HANDLE conn_handle, SESSION_HANDLE* session_handle)
{
    int result;

    if (conn_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_session_handle failed (conn_handle is NULL)");
    }
    else if (session_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_session_handle failed (session_handle is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)conn_handle;

        *session_handle = instance->session_handle;

        result = RESULT_OK;
    }

    return result;
}